

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.c
# Opt level: O3

int open_bonesfile(char *bonesid)

{
  int iVar1;
  char *__file;
  
  sprintf(bones,"bon%s",bonesid);
  __file = fqname(bones,0,0);
  iVar1 = open(__file,0,0);
  return iVar1;
}

Assistant:

int open_bonesfile(char *bonesid)
{
	const char *fq_bones;
	int fd;

	sprintf(bones, "bon%s", bonesid);
	fq_bones = fqname(bones, BONESPREFIX, 0);
	fd = open(fq_bones, O_RDONLY | O_BINARY, 0);
	return fd;
}